

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preferences.cpp
# Opt level: O1

double __thiscall
f8n::prefs::Preferences::GetDouble(Preferences *this,char *key,double defaultValue)

{
  double extraout_XMM0_Qa;
  allocator<char> local_39;
  double local_38;
  long *local_30 [2];
  long local_20 [2];
  
  local_38 = defaultValue;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,key,&local_39);
  (*(this->super_IPreferences)._vptr_IPreferences[0xc])(local_38,this,(string *)local_30);
  local_38 = extraout_XMM0_Qa;
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  return local_38;
}

Assistant:

double Preferences::GetDouble(const char* key, double defaultValue) {
    return this->GetDouble(std::string(key), defaultValue);
}